

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O0

void * nukedopl3_init(UINT32 clock,UINT32 rate)

{
  opl3_chip *opl3;
  UINT32 rate_local;
  UINT32 clock_local;
  
  _rate_local = calloc(1,0x5210);
  if (_rate_local == (void *)0x0) {
    _rate_local = (void *)0x0;
  }
  else {
    *(UINT32 *)((long)_rate_local + 8) = clock;
    *(UINT32 *)((long)_rate_local + 0xc) = rate;
  }
  return _rate_local;
}

Assistant:

void* nukedopl3_init(UINT32 clock, UINT32 rate)
{
	opl3_chip *opl3;

	opl3 = (opl3_chip*)calloc(1, sizeof(opl3_chip));
	if (opl3 == NULL)
		return NULL;
	
	opl3->clock = clock;
	opl3->smplRate = rate; // save for reset
	
	return opl3;
}